

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Str_ManCheckOverlap(Gia_Man_t *p,Vec_Wec_t *vGroups)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  Vec_Int_t *p_00;
  long lVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  
  iVar5 = vGroups->nSize;
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      uVar1 = vGroups->pArray[lVar9].nSize;
      uVar7 = (ulong)uVar1;
      if (0 < (int)uVar1) {
        pVVar8 = vGroups->pArray + lVar9;
        lVar10 = 0;
        do {
          if ((int)uVar7 != 1) {
            iVar5 = pVVar8->pArray[lVar10];
            Gia_ManIncrementTravId(p);
            Str_MuxTraverse_rec(p,iVar5);
            iVar2 = pVVar8->nSize;
            if ((long)iVar2 < 1) {
              lVar6 = 0;
LAB_007e369c:
              if ((int)lVar6 != iVar2) {
                iVar5 = pVVar8->nSize;
                if (1 < iVar5) {
                  lVar6 = 1;
                  do {
                    iVar5 = pVVar8->pArray[lVar6];
                    p_00 = Vec_WecPushLevel(vGroups);
                    if (vGroups->nSize <= lVar9) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
                    }
                    pVVar4 = vGroups->pArray;
                    pVVar8 = pVVar4 + lVar9;
                    Vec_IntPush(p_00,iVar5);
                    lVar6 = lVar6 + 1;
                    iVar5 = pVVar4[lVar9].nSize;
                  } while (lVar6 < iVar5);
                }
                if (iVar5 < 1) {
                  __assert_fail("p->nSize >= nSizeNew",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
                }
                pVVar8->nSize = 1;
              }
            }
            else {
              lVar6 = 0;
              do {
                iVar3 = pVVar8->pArray[lVar6];
                if (iVar5 != iVar3) {
                  if (p->nTravIdsAlloc <= iVar3) {
                    __assert_fail("Id < p->nTravIdsAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
                  }
                  if (p->pTravIds[iVar3] == p->nTravIds) goto LAB_007e369c;
                }
                lVar6 = lVar6 + 1;
              } while (iVar2 != lVar6);
            }
          }
          lVar10 = lVar10 + 1;
          uVar7 = (ulong)pVVar8->nSize;
        } while (lVar10 < (long)uVar7);
        iVar5 = vGroups->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
  }
  return;
}

Assistant:

void Str_ManCheckOverlap( Gia_Man_t * p, Vec_Wec_t * vGroups )
{   // check that members of each group are not in the TFI of each other
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, n, iObj, iObj2;

//    vGroup = Vec_WecEntry(vGroups, 7);
//    Vec_IntForEachEntry( vGroup, iObj, n )
//        Gia_ManPrintCone2( p, Gia_ManObj(p, iObj) ), printf( "\n" );

    Vec_WecForEachLevel( vGroups, vGroup, i )
    Vec_IntForEachEntry( vGroup, iObj, k )
    {
        if ( Vec_IntSize(vGroup) == 1 )
            continue;
        // high light the cone
        Gia_ManIncrementTravId( p );
        Str_MuxTraverse_rec( p, iObj );
        // check that none of the others are highlighted
        Vec_IntForEachEntry( vGroup, iObj2, n )
            if ( iObj != iObj2 && Gia_ObjIsTravIdCurrentId(p, iObj2) )
                break;
        if ( n == Vec_IntSize(vGroup) )
            continue;
        // split the group into individual trees
        Vec_IntForEachEntryStart( vGroup, iObj2, n, 1 )
        {
            vGroup2 = Vec_WecPushLevel( vGroups );
            vGroup  = Vec_WecEntry( vGroups, i );
            Vec_IntPush( vGroup2, iObj2 );
        }
        Vec_IntShrink( vGroup, 1 );

/*
        // this does not work because there can be a pair of independent trees
        // with another tree squeezed in between them, so that there is a combo loop

        // divide this group
        nNew = 0;
        vGroup2 = Vec_WecPushLevel( vGroups );
        vGroup  = Vec_WecEntry( vGroups, i );
        Vec_IntForEachEntry( vGroup, iObj2, n )
        {
            if ( iObj != iObj2 && Gia_ObjIsTravIdCurrentId(p, iObj2) )
                Vec_IntPush( vGroup2, iObj2 );
            else
                Vec_IntWriteEntry( vGroup, nNew++, iObj2 );
        }
        Vec_IntShrink( vGroup, nNew );
        i--;
        break;
*/

/*
        // check that none of the others are highlighted
        Vec_IntForEachEntry( vGroup, iObj, n )
            if ( n != k && Gia_ObjIsTravIdCurrentId(p, iObj) )
            {
                printf( "Overlap of TFI cones of trees %d and %d in group %d of size %d!\n", k, n, i, Vec_IntSize(vGroup) );
                Vec_IntShrink( vGroup, 1 );
                break;
            }
*/
    }
}